

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O0

uint64_t bitmanip::detail::duplBits_naive(uint64_t input,size_t out_bits_per_in_bits)

{
  commonSignedType<unsigned_long,_unsigned_long> cVar1;
  undefined8 local_48;
  size_t j;
  size_t b_out;
  size_t i;
  uint64_t result;
  commonSignedType<unsigned_long,_unsigned_long> lim;
  size_t out_bits_per_in_bits_local;
  uint64_t input_local;
  
  if (out_bits_per_in_bits == 0) {
    input_local = 0;
  }
  else {
    cVar1 = divCeil<unsigned_long,unsigned_long>(0x40,out_bits_per_in_bits);
    i = 0;
    j = 0;
    for (b_out = 0; b_out < cVar1; b_out = b_out + 1) {
      for (local_48 = 0; local_48 < out_bits_per_in_bits; local_48 = local_48 + 1) {
        i = (input >> ((byte)b_out & 0x3f) & 1) << ((byte)j & 0x3f) | i;
        j = j + 1;
      }
    }
    input_local = i;
  }
  return input_local;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t duplBits_naive(std::uint64_t input, std::size_t out_bits_per_in_bits) noexcept
{
    if (out_bits_per_in_bits == 0) {
        return 0;
    }
    const auto lim = bitmanip::divCeil<std::size_t>(64, out_bits_per_in_bits);

    std::uint64_t result = 0;
    for (std::size_t i = 0, b_out = 0; i < lim; ++i) {
        for (std::size_t j = 0; j < out_bits_per_in_bits; ++j, ++b_out) {
            result |= static_cast<std::uint64_t>((input >> i) & 1) << b_out;
        }
    }

    return result;
}